

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

int __thiscall re2::RepetitionWalker::ShortVisit(RepetitionWalker *this,Regexp *re,int parent_arg)

{
  ostream *poVar1;
  LogMessage local_1a0;
  int local_1c;
  Regexp *pRStack_18;
  int parent_arg_local;
  Regexp *re_local;
  RepetitionWalker *this_local;
  
  local_1c = parent_arg;
  pRStack_18 = re;
  re_local = (Regexp *)this;
  LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_1a0,
             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/parse.cc",0x20a);
  poVar1 = LogMessage::stream(&local_1a0);
  std::operator<<(poVar1,"RepetitionWalker::ShortVisit called");
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  return 0;
}

Assistant:

int RepetitionWalker::ShortVisit(Regexp* re, int parent_arg) {
  // This should never be called, since we use Walk and not
  // WalkExponential.
  LOG(DFATAL) << "RepetitionWalker::ShortVisit called";
  return 0;
}